

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O1

size_t mpn_get_str(uchar *sp,int base,mp_ptr up,mp_size_t un)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint bits;
  size_t sVar3;
  ulong uVar4;
  mpn_base_info info;
  mpn_base_info local_30;
  
  if (un < 1) {
    __assert_fail("un > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vbirds[P]Bignumber/mini-gmp.c"
                  ,0x521,"size_t mpn_get_str(unsigned char *, int, mp_ptr, mp_size_t)");
  }
  if (up[un + -1] == 0) {
    __assert_fail("up[un-1] > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vbirds[P]Bignumber/mini-gmp.c"
                  ,0x522,"size_t mpn_get_str(unsigned char *, int, mp_ptr, mp_size_t)");
  }
  bits = mpn_base_power_of_two_p(base);
  if (bits == 0) {
    uVar4 = (ulong)base;
    local_30.exp = 1;
    local_30.bb = uVar4;
    if (-1 < base) {
      do {
        local_30.bb = local_30.bb * uVar4;
        local_30.exp = local_30.exp + 1;
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar4;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = local_30.bb;
      } while (SUB168(auVar1 * auVar2,8) == 0);
    }
    sVar3 = mpn_get_str_other(sp,base,&local_30,up,un);
    return sVar3;
  }
  sVar3 = mpn_get_str_bits(sp,bits,up,un);
  return sVar3;
}

Assistant:

size_t
mpn_get_str (unsigned char *sp, int base, mp_ptr up, mp_size_t un)
{
  unsigned bits;

  assert (un > 0);
  assert (up[un-1] > 0);

  bits = mpn_base_power_of_two_p (base);
  if (bits)
    return mpn_get_str_bits (sp, bits, up, un);
  else
    {
      struct mpn_base_info info;

      mpn_get_base_info (&info, base);
      return mpn_get_str_other (sp, base, &info, up, un);
    }
}